

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O3

streamsize __thiscall NJamSpell::MemStream::xsputn(MemStream *this,char *s,streamsize n)

{
  size_t __n;
  
  if (0 < n) {
    __n = this->MaxSize - this->Pos;
    if (n <= (long)__n) {
      __n = n;
    }
    memcpy(this->Buff + this->Pos,s,__n);
    this->Pos = this->Pos + __n;
  }
  return n;
}

Assistant:

std::streamsize xsputn(const char* s, std::streamsize n) override {
        if (n <= 0) {
            return n;
        }
        long toCopy = std::min<long>(n, MaxSize - Pos);
        memcpy(Buff + Pos, s, toCopy);
        Pos += toCopy;
        return n;
    }